

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConn.cpp
# Opt level: O3

ssize_t __thiscall HttpConn::read(HttpConn *this,int __fd,void *__buf,size_t __nbytes)

{
  EventLoop *pEVar1;
  bool bVar2;
  int iVar3;
  StatusCode code;
  ssize_t sVar4;
  code *extraout_RAX;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  code *extraout_RAX_00;
  undefined7 extraout_var_01;
  char *__n;
  pointer pcVar5;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf_00;
  int __fd_00;
  pointer pcVar6;
  pointer buff;
  long lVar7;
  _Any_data local_90;
  code *local_80;
  code *local_78;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  pcVar6 = (this->readBuff_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar5 = (this->readBuff_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar7 = (long)this->read_idx_;
  if ((long)pcVar5 - (long)pcVar6 == lVar7) {
    std::vector<char,_std::allocator<char>_>::resize
              (&this->readBuff_,((long)pcVar5 - (long)pcVar6) * 2);
    pcVar6 = (this->readBuff_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar5 = (this->readBuff_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar7 = (long)this->read_idx_;
  }
  buff = pcVar6 + lVar7;
  __n = pcVar6 + lVar7;
  sVar4 = readn(this->fd_,buff,(long)pcVar5 - (long)__n);
  __fd_00 = (int)buff;
  iVar3 = (int)sVar4;
  if (iVar3 < 0) {
    std::__cxx11::string::_M_replace
              ((ulong)&this->body_,0,(char *)(this->body_)._M_string_length,0x121a27);
    code = BadRequest;
  }
  else {
    if (iVar3 == 0) {
      this->connStatus_ = Disconnecting;
      __buf_00 = extraout_RDX;
      if (this->parseState_ != Finished) {
        __n = "Request is not complete!";
        std::__cxx11::string::_M_replace
                  ((ulong)&this->body_,0,(char *)(this->body_)._M_string_length,0x121a3a);
        __fd_00 = 400;
        handleResponse(this,BadRequest);
        __buf_00 = extraout_RDX_00;
      }
      if (this->writeable_ != true) {
        pEVar1 = this->loop_;
        local_90._8_8_ = 0;
        local_90._M_unused._M_object = operator_new(0x18);
        *(code **)local_90._M_unused._0_8_ = close;
        *(undefined8 *)((long)local_90._M_unused._0_8_ + 8) = 0;
        *(HttpConn **)((long)local_90._M_unused._0_8_ + 0x10) = this;
        local_78 = std::_Function_handler<void_(),_std::_Bind<void_(HttpConn::*(HttpConn_*))()>_>::
                   _M_invoke;
        local_80 = std::_Function_handler<void_(),_std::_Bind<void_(HttpConn::*(HttpConn_*))()>_>::
                   _M_manager;
        EventLoop::runInLoop(pEVar1,(Functor *)&local_90);
        if (local_80 == (code *)0x0) {
          return (ssize_t)(code *)0x0;
        }
        bVar2 = (*local_80)(&local_90,&local_90,__destroy_functor);
        return CONCAT71(extraout_var_01,bVar2);
      }
      local_60 = (code *)write(this,__fd_00,__buf_00,(size_t)__n);
      goto LAB_0011709d;
    }
    this->read_idx_ = this->read_idx_ + iVar3;
    code = parseRequest(this);
    if (code == Wait) {
      Channel::update((this->channel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
      local_60 = extraout_RAX_00;
      goto LAB_0011709d;
    }
  }
  handleResponse(this,code);
  local_60 = extraout_RAX;
LAB_0011709d:
  if (this->connStatus_ == Connected) {
    pEVar1 = this->loop_;
    iVar3 = this->id_;
    if (this->linger_ == true) {
      local_70._8_8_ = 0;
      local_70._M_unused._M_object = operator_new(0x18);
      *(code **)local_70._M_unused._0_8_ = close;
      *(undefined8 *)((long)local_70._M_unused._0_8_ + 8) = 0;
      *(HttpConn **)((long)local_70._M_unused._0_8_ + 0x10) = this;
      local_58 = std::_Function_handler<void_(),_std::_Bind<void_(HttpConn::*(HttpConn_*))()>_>::
                 _M_invoke;
      local_60 = std::_Function_handler<void_(),_std::_Bind<void_(HttpConn::*(HttpConn_*))()>_>::
                 _M_manager;
      EventLoop::addTimer(pEVar1,iVar3,90000,(Functor *)&local_70);
      if (local_60 != (code *)0x0) {
        bVar2 = (*local_60)(&local_70,&local_70,__destroy_functor);
        local_60 = (code *)CONCAT71(extraout_var,bVar2);
      }
    }
    else {
      local_50._8_8_ = 0;
      local_50._M_unused._M_object = operator_new(0x18);
      *(code **)local_50._M_unused._0_8_ = close;
      *(undefined8 *)((long)local_50._M_unused._0_8_ + 8) = 0;
      *(HttpConn **)((long)local_50._M_unused._0_8_ + 0x10) = this;
      local_38 = std::_Function_handler<void_(),_std::_Bind<void_(HttpConn::*(HttpConn_*))()>_>::
                 _M_invoke;
      local_40 = std::_Function_handler<void_(),_std::_Bind<void_(HttpConn::*(HttpConn_*))()>_>::
                 _M_manager;
      EventLoop::addTimer(pEVar1,iVar3,8000,(Functor *)&local_50);
      local_60 = local_40;
      if (local_40 != (code *)0x0) {
        bVar2 = (*local_40)(&local_50,&local_50,__destroy_functor);
        local_60 = (code *)CONCAT71(extraout_var_00,bVar2);
      }
    }
  }
  return (ssize_t)local_60;
}

Assistant:

void HttpConn::read() {
    if (readBuff_.size() - read_idx_ == 0) readBuff_.resize(readBuff_.size() * 2);
    int readBytes = readn(fd_, readBuff_.data() + read_idx_, readBuff_.size() - read_idx_);
    if (readBytes < 0) {
        body_ = "Read Socket Error!";
        handleResponse(BadRequest);
    } else if (readBytes == 0) {
        connStatus_ = Disconnecting;
        if (parseState_ != Finished) {
            body_ = "Request is not complete!";
            handleResponse(BadRequest);
        }
        if (writeable_) 
            write();
        else {
            loop_->runInLoop(std::bind(&HttpConn::close, this));
            return;
        }
        
    }
    else {
        read_idx_ += readBytes;
        StatusCode c = parseRequest();
        if (c != Wait) {
            handleResponse(c);
        } else {
            channel_->update();
        }
    }
    
    if (connStatus_ == Connected) {
        if (linger_) 
            loop_->addTimer(id_, keepAliveTimeout, std::bind(&HttpConn::close, this)); 
        else 
            loop_->addTimer(id_, defaultTimeout, std::bind(&HttpConn::close, this));   
    }
    // handleConn();
}